

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Point3f __thiscall pbrt::ShapeSampleContext::OffsetRayOrigin(ShapeSampleContext *this,Vector3f *w)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  float fVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float fVar13;
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [60];
  undefined1 auVar14 [64];
  float fVar16;
  float fVar17;
  Normal3<float> NVar18;
  Vector3f VVar19;
  Point3f PVar20;
  float local_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined8 local_30;
  Point3<float> local_28;
  undefined1 extraout_var [60];
  
  auVar15 = in_ZMM1._4_60_;
  auVar12 = in_ZMM0._8_56_;
  NVar18 = Abs<pbrt::Normal3,float>((Tuple3<pbrt::Normal3,_float> *)(this + 0x18));
  auVar9._0_8_ = NVar18.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  _local_58 = auVar9._0_16_;
  local_48._0_4_ = NVar18.super_Tuple3<pbrt::Normal3,_float>.z;
  VVar19 = Point3fi::Error((Point3fi *)this);
  auVar14._0_4_ = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._4_60_ = auVar15;
  auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  auVar8 = vmovshdup_avx(auVar10._0_16_);
  auVar2 = vmovshdup_avx(_local_58);
  auVar8 = vfmadd213ss_fma(auVar8,auVar2,ZEXT416((uint)((float)local_48._0_4_ * auVar14._0_4_)));
  auVar2 = vfmsub213ss_fma(auVar14._0_16_,ZEXT416((uint)local_48._0_4_),
                           ZEXT416((uint)((float)local_48._0_4_ * auVar14._0_4_)));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ + auVar2._0_4_)),_local_58,auVar10._0_16_);
  fVar13 = auVar8._0_4_;
  local_48 = ZEXT416((uint)(fVar13 * *(float *)(this + 0x20)));
  local_58._4_4_ = (float)((ulong)*(undefined8 *)(this + 0x18) >> 0x20) * fVar13;
  local_58._0_4_ = (float)*(undefined8 *)(this + 0x18) * fVar13;
  fStack_50 = fVar13 * 0.0;
  fStack_4c = fVar13 * 0.0;
  auVar11._0_4_ = Dot<float>(w,(Normal3<float> *)(this + 0x18));
  auVar11._4_60_ = extraout_var;
  uVar3 = vcmpss_avx512f(auVar11._0_16_,ZEXT816(0) << 0x40,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  local_48._0_4_ = (uint)bVar4 * (local_48._0_4_ ^ 0x80000000) + (uint)!bVar4 * local_48._0_4_;
  if (auVar11._0_4_ < 0.0) {
    local_58 = (undefined1  [8])(local_58 ^ 0x8000000080000000);
    fStack_50 = (float)((uint)fStack_50 ^ 0x80000000);
    fStack_4c = (float)((uint)fStack_4c ^ 0x80000000);
  }
  Point3<float>::Point3<pbrt::Interval<float>>(&local_28,(Point3<pbrt::Interval<float>_> *)this);
  pfVar1 = (float *)((long)&local_30 + 4);
  iVar5 = 0;
  fVar17 = local_48._0_4_;
  fVar13 = local_58._0_4_;
  auVar8._0_4_ = local_28.super_Tuple3<pbrt::Point3,_float>.x + fVar13;
  auVar8._4_4_ = local_28.super_Tuple3<pbrt::Point3,_float>.y + local_58._4_4_;
  auVar8._8_4_ = local_58._8_4_ + 0.0;
  auVar8._12_4_ = local_58._12_4_ + 0.0;
  local_5c = fVar17 + local_28.super_Tuple3<pbrt::Point3,_float>.z;
  local_30 = vmovlps_avx(auVar8);
  auVar8 = vmovshdup_avx(_local_58);
  do {
    fVar16 = fVar13;
    if (((iVar5 != 0) && (fVar16 = auVar8._0_4_, iVar5 != 1)) && (fVar16 = fVar17, iVar5 == 3)) {
      PVar20.super_Tuple3<pbrt::Point3,_float>.z = local_5c;
      PVar20.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)local_30;
      PVar20.super_Tuple3<pbrt::Point3,_float>.y = (float)local_30._4_4_;
      return (Point3f)PVar20.super_Tuple3<pbrt::Point3,_float>;
    }
    if (fVar16 <= 0.0) {
      fVar16 = fVar13;
      if ((iVar5 != 0) && (fVar16 = auVar8._0_4_, iVar5 != 1)) {
        fVar16 = fVar17;
      }
      if (fVar16 < 0.0) {
        pfVar7 = (float *)&local_30;
        if ((iVar5 != 0) && (pfVar7 = pfVar1, iVar5 != 1)) {
          pfVar7 = &local_5c;
        }
        fVar16 = *pfVar7;
        fVar6 = -INFINITY;
        if (-INFINITY < fVar16) {
          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar16 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar16);
          fVar6 = (float)((int)fVar16 + -1 + (uint)(fVar16 <= 0.0) * 2);
        }
        goto LAB_0029c6cf;
      }
    }
    else {
      pfVar7 = (float *)&local_30;
      if ((iVar5 != 0) && (pfVar7 = pfVar1, iVar5 != 1)) {
        pfVar7 = &local_5c;
      }
      fVar16 = *pfVar7;
      fVar6 = INFINITY;
      if (fVar16 < INFINITY) {
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
        fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
        fVar6 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
      }
LAB_0029c6cf:
      pfVar7 = (float *)&local_30;
      if ((iVar5 != 0) && (pfVar7 = pfVar1, iVar5 != 1)) {
        pfVar7 = &local_5c;
      }
      *pfVar7 = fVar6;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU inline Point3f ShapeSampleContext::OffsetRayOrigin(const Vector3f &w) const {
    // Find vector _offset_ to corner of error bounds and compute initial _po_
    Float d = Dot(Abs(n), pi.Error());
    Vector3f offset = d * Vector3f(n);
    if (Dot(w, n) < 0)
        offset = -offset;
    Point3f po = Point3f(pi) + offset;

    // Round offset point _po_ away from _p_
    for (int i = 0; i < 3; ++i) {
        if (offset[i] > 0)
            po[i] = NextFloatUp(po[i]);
        else if (offset[i] < 0)
            po[i] = NextFloatDown(po[i]);
    }

    return po;
}